

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::NeuralNetwork::ByteSizeLong(NeuralNetwork *this)

{
  uint uVar1;
  Type *value;
  size_t sVar2;
  Type *value_00;
  size_t sVar3;
  uint i;
  uint uVar4;
  ulong uVar5;
  
  uVar1 = (this->layers_).super_RepeatedPtrFieldBase.current_size_;
  uVar5 = (ulong)uVar1;
  for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      (&(this->layers_).super_RepeatedPtrFieldBase,uVar4);
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::NeuralNetworkLayer>(value);
    uVar5 = uVar5 + sVar2;
  }
  uVar1 = (this->preprocessing_).super_RepeatedPtrFieldBase.current_size_;
  sVar2 = uVar5 + uVar1;
  for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
    value_00 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkPreprocessing>::TypeHandler>
                         (&(this->preprocessing_).super_RepeatedPtrFieldBase,uVar4);
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::NeuralNetworkPreprocessing>(value_00);
    sVar2 = sVar2 + sVar3;
  }
  if (this != (NeuralNetwork *)&_NeuralNetwork_default_instance_ &&
      this->updateparams_ != (NetworkUpdateParameters *)0x0) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::NetworkUpdateParameters>
                      (this->updateparams_);
    sVar2 = sVar2 + sVar3 + 1;
  }
  if (this->arrayinputshapemapping_ != 0) {
    sVar3 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended
                      (this->arrayinputshapemapping_);
    sVar2 = sVar2 + sVar3 + 1;
  }
  if (this->imageinputshapemapping_ != 0) {
    sVar3 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended
                      (this->imageinputshapemapping_);
    sVar2 = sVar2 + sVar3 + 1;
  }
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t NeuralNetwork::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.NeuralNetwork)
  size_t total_size = 0;

  // repeated .CoreML.Specification.NeuralNetworkLayer layers = 1;
  {
    unsigned int count = this->layers_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->layers(i));
    }
  }

  // repeated .CoreML.Specification.NeuralNetworkPreprocessing preprocessing = 2;
  {
    unsigned int count = this->preprocessing_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->preprocessing(i));
    }
  }

  // .CoreML.Specification.NetworkUpdateParameters updateParams = 10;
  if (this->has_updateparams()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->updateparams_);
  }

  // .CoreML.Specification.NeuralNetworkMultiArrayShapeMapping arrayInputShapeMapping = 5;
  if (this->arrayinputshapemapping() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->arrayinputshapemapping());
  }

  // .CoreML.Specification.NeuralNetworkImageShapeMapping imageInputShapeMapping = 6;
  if (this->imageinputshapemapping() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->imageinputshapemapping());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}